

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

void tommy_tree_foreach_arg_node(tommy_tree_node *root,tommy_foreach_arg_func *func,void *arg)

{
  long lVar1;
  tommy_tree_node *root_00;
  long in_FS_OFFSET;
  tommy_tree_node *next;
  void *arg_local;
  tommy_foreach_arg_func *func_local;
  tommy_tree_node *root_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root != (tommy_tree_node *)0x0) {
    tommy_tree_foreach_arg_node(root->prev,func,arg);
    root_00 = root->next;
    (*func)(arg,root->data);
    tommy_tree_foreach_arg_node(root_00,func,arg);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void tommy_tree_foreach_arg_node(tommy_tree_node* root, tommy_foreach_arg_func* func, void* arg)
{
	tommy_tree_node* next;

	if (!root)
		return;

	tommy_tree_foreach_arg_node(root->prev, func, arg);

	/* make a copy in case func is free() */
	next = root->next;

	func(arg, root->data);

	tommy_tree_foreach_arg_node(next, func, arg);
}